

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void kratos::hash_generators_context(Context *context,Generator *root,HashStrategy strategy)

{
  Generator *pGVar1;
  undefined8 uVar2;
  pointer ppVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  uint64_t hash;
  Generator **node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args;
  pointer *pppGVar9;
  uint64_t j;
  ulong uVar10;
  undefined1 local_1d8 [8];
  thread_pool pool;
  GeneratorGraph g;
  future<unsigned_long> task;
  undefined1 auStack_a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hash_values;
  __normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
  _Stack_88;
  vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> thread_tasks;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  levels;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> list;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  
  if (context->track_generated_ == false) {
    std::
    _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(context->generator_hash_)._M_h);
  }
  GeneratorGraph::GeneratorGraph
            ((GeneratorGraph *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
             root);
  if (strategy == ParallelHash) {
    uVar5 = get_num_cpus();
    cxxpool::thread_pool::thread_pool((thread_pool *)local_1d8,(ulong)uVar5);
    GeneratorGraph::get_leveled_nodes
              ((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                *)&thread_tasks.
                   super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (GeneratorGraph *)
               &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((long)levels.
                          super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                   (long)thread_tasks.
                         super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x18 & 0xffffffff);
    while( true ) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&_Var7._M_pi[-1]._M_weak_count + 3);
      uVar6 = (uint)p_Var8;
      if ((int)uVar6 < 0) break;
      task.super___basic_future<unsigned_long>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var8;
      std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
                ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 &levels.
                  super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 ((ulong)(uVar6 & 0x7fffffff) * 0x18 +
                 (long)thread_tasks.
                       super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage));
      auStack_a8 = (undefined1  [8])0x0;
      hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_88._M_current = (future<unsigned_long> *)0x0;
      thread_tasks.
      super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      thread_tasks.
      super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::reserve
                ((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *
                 )&_Stack_88,
                 (long)list.
                       super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 (long)levels.
                       super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
      for (pppGVar9 = (pointer *)
                      levels.
                      super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pointer)pppGVar9 !=
          list.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl
          .super__Vector_impl_data._M_start; pppGVar9 = pppGVar9 + 1) {
        cxxpool::thread_pool::push<unsigned_long(&)(kratos::Generator*),kratos::Generator*const&>
                  ((thread_pool *)&g.root_,(_func_unsigned_long_Generator_ptr *)local_1d8,
                   (Generator **)hash_generator);
        std::vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>::
        emplace_back<std::future<unsigned_long>>
                  ((vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>> *)
                   &_Stack_88,(future<unsigned_long> *)&g.root_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&task);
      }
      cxxpool::
      get<std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<std::future<unsigned_long>*,std::vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>>,void>
                (_Stack_88,
                 (__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
                  )thread_tasks.
                   super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_a8);
      for (uVar10 = 0;
          uVar10 < (ulong)((long)list.
                                 super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)levels.
                                 super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
          uVar10 = uVar10 + 1) {
        Context::add_hash(context,(Generator *)
                                  (&((levels.
                                      super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                    super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start)[uVar10],
                          *(uint64_t *)((long)auStack_a8 + uVar10 * 8));
      }
      std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::~vector
                ((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *
                 )&_Stack_88);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_a8);
      std::_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~_Vector_base
                ((_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 &levels.
                  super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      _Var7 = task.super___basic_future<unsigned_long>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    }
    std::
    vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
    ::~vector((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
               *)&thread_tasks.
                  super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cxxpool::thread_pool::~thread_pool((thread_pool *)local_1d8);
  }
  else if (strategy == SequentialHash) {
    GeneratorGraph::get_sorted_nodes
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &thread_tasks.
                super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (GeneratorGraph *)
               &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    levels.
    super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &levels.
                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)levels.
                     super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start -
               (long)thread_tasks.
                     super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
    for (__args = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  thread_tasks.
                  super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pppGVar9 = (pointer *)
                   levels.
                   super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
        (pointer)__args !=
        levels.
        super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start; __args = __args + 1) {
      pGVar1 = (Generator *)
               (((__basic_future<unsigned_long> *)&__args->_M_pi)->_M_state).
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (((pGVar1->lib_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (pGVar1->lib_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) && ((pGVar1->is_external_ & 1U) == 0)) {
        Context::get_generators_by_name
                  ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)local_1d8,context,&pGVar1->name);
        ppVar3 = pool.tasks_.c.
                 super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     *)local_1d8);
        pGVar1 = (Generator *)
                 (((__basic_future<unsigned_long> *)&__args->_M_pi)->_M_state).
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (ppVar3 == (pointer)0x1) {
          hash_generator_name(context,pGVar1);
        }
        else {
          iVar4 = (*(pGVar1->super_IRNode)._vptr_IRNode[4])(pGVar1);
          if ((CONCAT44(extraout_var,iVar4) != 0) ||
             ((Generator *)
              (((__basic_future<unsigned_long> *)&__args->_M_pi)->_M_state).
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == root)) {
            std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
            emplace_back<kratos::Generator*const&>
                      ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
                       &levels.
                        super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Generator **)__args);
          }
        }
      }
      else {
        Generator::external_filename_abi_cxx11_((string *)local_1d8,pGVar1);
        uVar2 = pool._0_8_;
        std::__cxx11::string::~string((string *)local_1d8);
        if (uVar2 != 0) {
          hash_generator_src(context,(Generator *)
                                     (((__basic_future<unsigned_long> *)&__args->_M_pi)->_M_state).
                                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        }
      }
    }
    for (; (pointer)pppGVar9 != (pointer)0x0; pppGVar9 = pppGVar9 + 1) {
      hash = hash_generator((Generator *)*pppGVar9);
      Context::add_hash(context,(Generator *)*pppGVar9,hash);
    }
    std::_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~_Vector_base
              ((_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &levels.
                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~_Vector_base
              ((_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &thread_tasks.
                super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  return;
}

Assistant:

void hash_generators_context(Context* context, Generator* root, HashStrategy strategy) {
    // clear the hash first
    if (!context->track_generated()) context->clear_hash();

    // compute the generator graph
    GeneratorGraph g(root);
    // if it's sequential, do topological sort
    // if it's parallel, do level sort

    if (strategy == HashStrategy::SequentialHash) {
        auto const& sequence = g.get_sorted_nodes();
        std::vector<Generator*> list;
        // reserve for list
        list.reserve(sequence.size());

        for (auto const& node : sequence) {
            // different cases
            if (node->external()) {
                if (node->external_filename().empty()) {
                    // user marked external file, skip it
                    continue;
                } else {
                    hash_generator_src(context, node);
                }
            } else if (context->get_generators_by_name(node->name).size() == 1) {
                // just need to hash the name
                hash_generator_name(context, node);
            } else {
                // only the one being used
                if (node->parent() == nullptr && node != root) continue;
                list.emplace_back(node);
            }
        }
        for (auto const& node : list) {
            uint64_t hash = hash_generator(node);
            context->add_hash(node, hash);
        }
    } else if (strategy == HashStrategy::ParallelHash) {
        uint32_t num_cpus = get_num_cpus();
        cxxpool::thread_pool pool{num_cpus};

        auto levels = g.get_leveled_nodes();
        // we proceed in a reversed order
        for (int i = static_cast<int>(levels.size() - 1); i >= 0; i--) {
            auto list = levels[i];
            std::vector<uint64_t> hash_values;
            std::vector<std::future<uint64_t>> thread_tasks;
            thread_tasks.reserve(list.size());

            for (auto const& node : list) {
                auto task = pool.push(hash_generator, node);
                thread_tasks.emplace_back(std::move(task));
            }

            cxxpool::get(thread_tasks.begin(), thread_tasks.end(), hash_values);
            for (uint64_t j = 0; j < list.size(); j++) {
                auto const& node = list[j];
                auto const hash = hash_values[j];
                context->add_hash(node, hash);
            }
        }
    }
}